

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
          (QMovableArrayOps<QMimeType> *this,qsizetype i,QMimeType *args)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QMimeType *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QMimeType tmp;
  QMimeType *in_stack_ffffffffffffff78;
  Inserter *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff9c;
  QArrayDataPointer<QMimeType> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<QMimeType>::needsDetach
                    ((QArrayDataPointer<QMimeType> *)in_stack_ffffffffffffff80);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QMimeType>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMimeType> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QMimeType>::end((QArrayDataPointer<QMimeType> *)in_stack_ffffffffffffff80);
      QMimeType::QMimeType((QMimeType *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceTo = (QMimeType *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_008ec123;
    }
    if ((in_RSI == (QMimeType *)0x0) &&
       (qVar3 = QArrayDataPointer<QMimeType>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMimeType> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QMimeType>::begin((QArrayDataPointer<QMimeType> *)0x8ebfca);
      QMimeType::QMimeType((QMimeType *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QMimeType *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_008ec123;
    }
  }
  QMimeType::QMimeType((QMimeType *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = in_RDI->displaceTo != (QMimeType *)0x0;
  uVar4 = bVar2 && in_RSI == (QMimeType *)0x0;
  QArrayDataPointer<QMimeType>::detachAndGrow
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(qsizetype)in_RDI,
             (QMimeType **)CONCAT17(uVar4,in_stack_ffffffffffffff88),
             (QArrayDataPointer<QMimeType> *)in_stack_ffffffffffffff80);
  if (bVar2 && in_RSI == (QMimeType *)0x0) {
    QArrayDataPointer<QMimeType>::begin((QArrayDataPointer<QMimeType> *)0x8ec07d);
    QMimeType::QMimeType((QMimeType *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QMimeType *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QMimeType> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff88),
                       (qsizetype)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Inserter::~Inserter(in_RDI);
  }
  QMimeType::~QMimeType((QMimeType *)0x8ec123);
LAB_008ec123:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }